

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall mjs::interpreter::impl::scope::scope(scope *this,object_ptr *act,scope_ptr *prev)

{
  gc_heap *args_1;
  uint32_t local_28;
  
  args_1 = (act->super_gc_heap_ptr_untyped).heap_;
  this->heap_ = args_1;
  (this->activation_).pos_ = (act->super_gc_heap_ptr_untyped).pos_;
  (this->prev_).pos_ = (prev->super_gc_heap_ptr_untyped).pos_;
  gc_heap::
  allocate_and_construct<mjs::gc_vector<mjs::function_definition_const*>,mjs::gc_heap&,unsigned_int&>
            ((gc_heap *)&stack0xffffffffffffffd0,(size_t)args_1,(gc_heap *)0x10,(uint *)args_1);
  (this->active_functions_).pos_ = local_28;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  gc_heap::
  allocate_and_construct<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,false>>,mjs::gc_heap&,unsigned_int&>
            ((gc_heap *)&stack0xffffffffffffffd0,(size_t)this->heap_,(gc_heap *)0x10,
             (uint *)this->heap_);
  (this->active_function_values_).pos_ = local_28;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

explicit scope(const object_ptr& act, const scope_ptr& prev)
            : heap_(act.heap())
            , activation_(act)
            , prev_(prev)
            , active_functions_(gc_vector<const function_definition*>::make(heap_, 4))
            , active_function_values_(gc_vector<weak_object_ptr>::make(heap_, 4)) {
        }